

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O1

lws * lws_adopt_socket_readbuf
                (lws_context *context,lws_sockfd_type accept_fd,char *readbuf,size_t len)

{
  lws *plVar1;
  lws_adopt_desc_t local_38;
  
  local_38.vh = context->vhost_list;
  local_38.vh_prot_name = (char *)0x0;
  local_38.parent = (lws *)0x0;
  local_38.opaque = (void *)0x0;
  local_38.fd.sockfd = accept_fd;
  local_38.type = LWS_ADOPT_ALLOW_SSL|LWS_ADOPT_SOCKET|LWS_ADOPT_HTTP;
  plVar1 = lws_adopt_descriptor_vhost_via_info(&local_38);
  plVar1 = adopt_socket_readbuf(plVar1,readbuf,len);
  return plVar1;
}

Assistant:

struct lws *
lws_adopt_socket_readbuf(struct lws_context *context, lws_sockfd_type accept_fd,
			 const char *readbuf, size_t len)
{
        return adopt_socket_readbuf(lws_adopt_socket(context, accept_fd),
				    readbuf, len);
}